

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O1

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  int iVar10;
  ssize_t avail;
  size_t nbytes_read;
  ssize_t nl;
  ssize_t ravail;
  byte *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_58 = (byte *)__archive_read_filter_ahead(filter,1,(ssize_t *)&local_50);
  if (local_58 != (byte *)0x0) {
    local_38 = local_50;
    local_48 = local_50;
    uVar5 = 0x14;
    while ((uVar4 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,
                                 &local_40,&local_48), -1 < (long)uVar4 && (local_40 != 0))) {
      if (((long)(uVar4 - local_40) < 0xb) ||
         (*(short *)(local_58 + 4) != 0x206e || *(int *)local_58 != 0x69676562)) {
        if ((0x11 < (long)(uVar4 - local_40)) &&
           (*(long *)(local_58 + 5) == 0x203436657361622d && *(long *)local_58 == 0x61622d6e69676562
           )) {
          lVar6 = 0xd;
          goto LAB_0045436c;
        }
        bVar3 = false;
        lVar6 = 0;
      }
      else {
        lVar6 = 6;
LAB_0045436c:
        bVar3 = true;
      }
      iVar10 = (int)lVar6;
      if ((((!bVar3) || ((byte)(local_58[lVar6] - 0x38) < 0xf8)) ||
          ((byte)(local_58[lVar6 + 1] - 0x38) < 0xf8)) ||
         (((byte)(local_58[lVar6 + 2] - 0x38) < 0xf8 || (local_58[lVar6 + 3] != 0x20)))) {
        iVar10 = 0;
      }
      local_58 = local_58 + uVar4;
      if (iVar10 != 0) {
        if (local_50 == uVar4) {
          return 0;
        }
        local_50 = local_50 - uVar4;
        uVar4 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,&local_40,
                             &local_48);
        if (local_40 == 0 || (long)uVar4 < 0) {
          return 0;
        }
        lVar6 = local_50 - uVar4;
        if (iVar10 == 6) {
          bVar2 = *local_58;
          if (""[bVar2] == '\0') {
            return 0;
          }
          local_58 = local_58 + 1;
          uVar7 = bVar2 & 0x3f;
          uVar9 = (ulong)uVar7 ^ 0x20;
          if (0x2d < (byte)uVar9) {
            return 0;
          }
          lVar6 = uVar4 - 1;
          if (lVar6 - local_40 < (long)uVar9) {
            return 0;
          }
          if ((char)uVar7 != ' ') {
            lVar6 = 1;
            pbVar8 = local_58;
            do {
              if (""[*pbVar8] == '\0') {
                return 0;
              }
              lVar6 = lVar6 + 1;
              pbVar8 = pbVar8 + 1;
            } while ((int)lVar6 - (int)uVar9 != 1);
            lVar6 = uVar4 - lVar6;
            local_58 = local_58 + (ulong)((int)uVar9 - 1) + 1;
          }
          if ((lVar6 - local_40 == 1) && (""[*local_58] != '\0' || (byte)(*local_58 + 0x9f) < 0x1a))
          {
            local_58 = local_58 + 1;
          }
          if (local_50 == uVar4) {
            return 0;
          }
          uVar1 = ""[local_58[local_40]];
        }
        else {
          if (iVar10 != 0xd) {
            return 0;
          }
          pbVar8 = local_58;
          if (uVar4 - local_40 != 0 && local_40 <= (long)uVar4) {
            pbVar8 = local_58 + (uVar4 - local_40);
            do {
              if (""[*local_58] == '\0') {
                return 0;
              }
              uVar4 = uVar4 - 1;
              local_58 = local_58 + 1;
            } while (local_40 < (long)uVar4);
          }
          pbVar8 = pbVar8 + local_40;
          if (((4 < lVar6) && (pbVar8[4] == 10 && *(int *)pbVar8 == 0x3d3d3d3d)) ||
             ((5 < lVar6 && (*(short *)(pbVar8 + 4) == 0xa0d && *(int *)pbVar8 == 0x3d3d3d3d)))) {
            return uVar5 | 0x28;
          }
          if (lVar6 < 1) {
            return 0;
          }
          uVar1 = ""[*pbVar8];
        }
        iVar10 = 0;
        if (uVar1 != '\0') {
          iVar10 = uVar5 + 0x1e;
        }
        return iVar10;
      }
      uVar5 = 0;
      local_50 = local_50 - uVar4;
      if (0x1ffff < local_48) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		/* "begin " */
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		if (l > len - nl)
			return (0); /* Line too short. */
		while (l) {
			if (!uuchar[*b++])
				return (0);
			--len;
			--l;
		}
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	} else if (l == 13) {
		/* "begin-base64 " */
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}